

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsocketnotifier.cpp
# Opt level: O0

void QSocketNotifier::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QMetaType QVar2;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QSocketNotifier *in_RDI;
  long in_FS_OFFSET;
  QSocketNotifier *_t;
  QSocketNotifier *in_stack_ffffffffffffff78;
  QMetaType local_38;
  QMetaTypeInterface *local_30;
  QMetaTypeInterface *local_28;
  QMetaType local_20;
  QMetaType local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      local_c = **(undefined4 **)(in_RCX + 8);
      activated(in_RDI,local_c,**(undefined4 **)(in_RCX + 0x10));
      break;
    case 1:
      QSocketDescriptor::operator_cast_to_int(*(QSocketDescriptor **)(in_RCX + 8));
      activated(in_RDI);
      break;
    case 2:
      activated(in_RDI);
      break;
    case 3:
      setEnabled(in_stack_ffffffffffffff78,false);
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 0) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_28 = (QMetaTypeInterface *)QMetaType::fromType<QSocketDescriptor>();
        **(undefined8 **)in_RCX = local_28;
      }
      else if (**(int **)(in_RCX + 8) == 1) {
        local_30 = (QMetaTypeInterface *)QMetaType::fromType<QSocketNotifier::Type>();
        **(undefined8 **)in_RCX = local_30;
      }
      else {
        memset(&local_20,0,8);
        QMetaType::QMetaType(&local_20);
        **(undefined8 **)in_RCX = local_20.d_ptr;
      }
    }
    else if (in_EDX == 1) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar2 = QMetaType::fromType<QSocketDescriptor>();
        **(undefined8 **)in_RCX = QVar2.d_ptr;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        **(undefined8 **)in_RCX = local_38.d_ptr;
      }
    }
    else {
      memset(&local_18,0,8);
      QMetaType::QMetaType(&local_18);
      **(undefined8 **)in_RCX = local_18.d_ptr;
    }
  }
  if ((in_ESI == 5) &&
     (bVar1 = QtMocHelpers::
              indexOfMethod<void(QSocketNotifier::*)(QSocketDescriptor,QSocketNotifier::Type,QSocketNotifier::QPrivateSignal)>
                        (in_RCX,(void **)activated,0,0), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QSocketNotifier::*)(int,QSocketNotifier::QPrivateSignal)>
              (in_RCX,(void **)activated,0,2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSocketNotifier::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSocketNotifier *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QSocketDescriptor>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSocketNotifier::Type>>(_a[2])), QPrivateSignal()); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<QSocketDescriptor>>(_a[1])), QPrivateSignal()); break;
        case 2: _t->activated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketDescriptor >(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketNotifier::Type >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketDescriptor >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSocketNotifier::*)(QSocketDescriptor , QSocketNotifier::Type , QPrivateSignal)>(_a, &QSocketNotifier::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSocketNotifier::*)(int , QPrivateSignal)>(_a, &QSocketNotifier::activated, 2))
            return;
    }
}